

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O0

String * __thiscall kj::Url::toString(String *__return_storage_ptr__,Url *this,Context context)

{
  kj *pkVar1;
  String *this_00;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  String *params;
  String *params_00;
  String *params_01;
  String *params_02;
  String *params_03;
  String *params_04;
  StringPtr SVar5;
  ArrayPtr<const_char> AVar6;
  ArrayPtr<const_char> text;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  byte local_31d;
  byte local_31a;
  Array<char> local_280;
  char local_261;
  ArrayPtr<const_char> local_260;
  String local_250;
  char local_231;
  kj *local_230;
  String *f_2;
  String *_f485;
  char *local_218;
  String local_210;
  char local_1f1;
  ArrayPtr<const_char> local_1f0;
  String local_1e0;
  char local_1c1;
  kj *local_1c0;
  QueryParam *param;
  QueryParam *__end1_1;
  QueryParam *__begin1_1;
  Vector<kj::Url::QueryParam> *__range1_1;
  undefined1 auStack_198 [6];
  bool first;
  size_t local_190;
  String local_188;
  char local_169;
  Fault local_168;
  Fault f_1;
  StringPtr local_150;
  StringPtr local_140;
  bool local_12b;
  DebugExpression local_12a;
  bool local_129;
  kj *pkStack_128;
  bool _kjCondition;
  String *pathPart;
  String *__end1;
  String *__begin1;
  Vector<kj::String> *__range1;
  size_t local_100;
  Fault local_f8;
  Fault f;
  char local_d9;
  ArrayPtr<const_char> local_d8;
  String local_c8;
  char local_a9;
  kj *local_a8;
  String *pass;
  String *_pass436;
  char *local_90;
  String local_88;
  kj *local_70;
  UserInfo *user;
  UserInfo *_user433;
  size_t local_58;
  undefined1 local_40 [8];
  Vector<char> chars;
  Context context_local;
  Url *this_local;
  
  chars.builder.disposer._4_4_ = context;
  Vector<char>::Vector((Vector<char> *)local_40,0x80);
  if (chars.builder.disposer._4_4_ != HTTP_REQUEST) {
    Vector<char>::addAll<kj::String_const&>((Vector<char> *)local_40,&this->scheme);
    SVar5 = operator____kj("://",3);
    local_58 = SVar5.content.size_;
    _user433 = (UserInfo *)SVar5.content.ptr;
    Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_40,(StringPtr *)&_user433);
    if (chars.builder.disposer._4_4_ == REMOTE_HREF) {
      user = kj::_::readMaybe<kj::Url::UserInfo>(&this->userInfo);
      if ((kj *)user != (kj *)0x0) {
        local_70 = (kj *)user;
        if (((this->options).percentDecode & 1U) == 0) {
          str<kj::String_const&>(&local_88,(kj *)user,params);
        }
        else {
          AVar6 = String::operator_cast_to_ArrayPtr(&user->username);
          text.ptr = (char *)AVar6.size_;
          _pass436 = (String *)AVar6.ptr;
          text.size_ = (size_t)_pass436;
          local_90 = text.ptr;
          encodeUriUserInfo(&local_88,(kj *)_pass436,text);
        }
        Vector<char>::addAll<kj::String>((Vector<char> *)local_40,&local_88);
        String::~String(&local_88);
        pass = kj::_::readMaybe<kj::String>
                         ((Maybe<kj::String> *)
                          &(local_70->__promise).super_CoroutineBase.super_PromiseNode.
                           super_PromiseArenaMember.arena);
        if ((kj *)pass != (kj *)0x0) {
          local_a9 = ':';
          local_a8 = (kj *)pass;
          Vector<char>::add<char>((Vector<char> *)local_40,&local_a9);
          if (((this->options).percentDecode & 1U) == 0) {
            str<kj::String_const&>(&local_c8,local_a8,params_00);
          }
          else {
            local_d8 = String::operator_cast_to_ArrayPtr((String *)local_a8);
            AVar6.ptr = (char *)local_d8.size_;
            AVar6.size_ = (size_t)local_d8.ptr;
            encodeUriUserInfo(&local_c8,(kj *)local_d8.ptr,AVar6);
          }
          Vector<char>::addAll<kj::String>((Vector<char> *)local_40,&local_c8);
          String::~String(&local_c8);
        }
        local_d9 = '@';
        Vector<char>::add<char>((Vector<char> *)local_40,&local_d9);
      }
    }
    AVar6 = String::operator_cast_to_ArrayPtr(&this->host);
    f.exception = (Exception *)AVar6.ptr;
    bVar2 = kj::parse::CharGroup_::containsAll
                      ((CharGroup_ *)(anonymous_namespace)::HOST_CHARS,AVar6);
    if (bVar2) {
      Vector<char>::addAll<kj::String_const&>((Vector<char> *)local_40,&this->host);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::String_const&>
                (&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x1c5,FAILED,(char *)0x0,"\"invalid hostname when stringifying URL\", host",
                 (char (*) [39])"invalid hostname when stringifying URL",&this->host);
      SVar5 = operator____kj("invalid-host",0xc);
      local_100 = SVar5.content.size_;
      __range1 = (Vector<kj::String> *)SVar5.content.ptr;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_40,(StringPtr *)&__range1);
      kj::_::Debug::Fault::~Fault(&local_f8);
    }
  }
  __begin1 = (String *)&this->path;
  __end1 = Vector<kj::String>::begin((Vector<kj::String> *)__begin1);
  pathPart = Vector<kj::String>::end((Vector<kj::String> *)__begin1);
  for (; this_00 = __end1, __end1 != pathPart; __end1 = __end1 + 1) {
    pkStack_128 = (kj *)__end1;
    StringPtr::StringPtr(&local_140,"");
    bVar2 = String::operator==(this_00,&local_140);
    local_31a = 1;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_31a = (this->options).allowEmpty;
    }
    local_12b = (bool)(local_31a & 1);
    local_12a = (DebugExpression)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12b);
    bVar2 = kj::_::DebugExpression::operator_cast_to_bool(&local_12a);
    pkVar1 = pkStack_128;
    local_31d = 0;
    if (bVar2) {
      StringPtr::StringPtr(&local_150,".");
      bVar2 = String::operator==((String *)pkVar1,&local_150);
      pkVar1 = pkStack_128;
      local_31d = 0;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        StringPtr::StringPtr((StringPtr *)&f_1,"..");
        bVar2 = String::operator==((String *)pkVar1,(StringPtr *)&f_1);
        local_31d = bVar2 ^ 0xff;
      }
    }
    local_129 = (bool)(local_31d & 1);
    if (local_129 == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,bool&,char_const(&)[25],kj::Vector<kj::String>const&>
                (&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x1cf,FAILED,
                 "(pathPart != \"\" || options.allowEmpty) && pathPart != \".\" && pathPart != \"..\""
                 ,"_kjCondition,\"invalid name in URL path\", path",&local_129,
                 (char (*) [25])"invalid name in URL path",&this->path);
      kj::_::Debug::Fault::fatal(&local_168);
    }
    local_169 = '/';
    Vector<char>::add<char>((Vector<char> *)local_40,&local_169);
    if (((this->options).percentDecode & 1U) == 0) {
      str<kj::String_const&>(&local_188,pkStack_128,params_01);
    }
    else {
      AVar6 = String::operator_cast_to_ArrayPtr((String *)pkStack_128);
      text_00.ptr = (char *)AVar6.size_;
      text_00.size_ = (size_t)AVar6.ptr;
      _auStack_198 = AVar6;
      encodeUriPath(&local_188,(kj *)AVar6.ptr,text_00);
    }
    Vector<char>::addAll<kj::String>((Vector<char> *)local_40,&local_188);
    String::~String(&local_188);
  }
  if ((this->hasTrailingSlash & 1U) == 0) {
    sVar3 = Vector<kj::String>::size(&this->path);
    if ((sVar3 != 0) || (chars.builder.disposer._4_4_ != HTTP_REQUEST)) goto LAB_00611573;
  }
  __range1_1._7_1_ = 0x2f;
  Vector<char>::add<char>((Vector<char> *)local_40,(char *)((long)&__range1_1 + 7));
LAB_00611573:
  __range1_1._6_1_ = 1;
  __begin1_1 = (QueryParam *)&this->query;
  __end1_1 = Vector<kj::Url::QueryParam>::begin((Vector<kj::Url::QueryParam> *)__begin1_1);
  param = Vector<kj::Url::QueryParam>::end((Vector<kj::Url::QueryParam> *)__begin1_1);
  for (; __end1_1 != param; __end1_1 = __end1_1 + 1) {
    local_1c0 = (kj *)__end1_1;
    local_1c1 = '&';
    if ((__range1_1._6_1_ & 1) != 0) {
      local_1c1 = '?';
    }
    Vector<char>::add<char>((Vector<char> *)local_40,&local_1c1);
    __range1_1._6_1_ = 0;
    if (((this->options).percentDecode & 1U) == 0) {
      str<kj::String_const&>(&local_1e0,local_1c0,params_02);
    }
    else {
      AVar6 = String::operator_cast_to_ArrayPtr((String *)local_1c0);
      text_01.ptr = (char *)AVar6.size_;
      text_01.size_ = (size_t)AVar6.ptr;
      local_1f0 = AVar6;
      encodeWwwForm(&local_1e0,(kj *)AVar6.ptr,text_01);
    }
    Vector<char>::addAll<kj::String>((Vector<char> *)local_40,&local_1e0);
    String::~String(&local_1e0);
    pcVar4 = String::begin((String *)
                           &(local_1c0->__promise).super_CoroutineBase.super_PromiseNode.
                            super_PromiseArenaMember.arena);
    if (pcVar4 != (char *)0x0) {
      local_1f1 = '=';
      Vector<char>::add<char>((Vector<char> *)local_40,&local_1f1);
      if (((this->options).percentDecode & 1U) == 0) {
        str<kj::String_const&>
                  (&local_210,
                   (kj *)&(local_1c0->__promise).super_CoroutineBase.super_PromiseNode.
                          super_PromiseArenaMember.arena,params_03);
      }
      else {
        AVar6 = String::operator_cast_to_ArrayPtr
                          ((String *)
                           &(local_1c0->__promise).super_CoroutineBase.super_PromiseNode.
                            super_PromiseArenaMember.arena);
        text_02.ptr = (char *)AVar6.size_;
        _f485 = (String *)AVar6.ptr;
        text_02.size_ = (size_t)_f485;
        local_218 = text_02.ptr;
        encodeWwwForm(&local_210,(kj *)_f485,text_02);
      }
      Vector<char>::addAll<kj::String>((Vector<char> *)local_40,&local_210);
      String::~String(&local_210);
    }
  }
  if (chars.builder.disposer._4_4_ == REMOTE_HREF) {
    f_2 = kj::_::readMaybe<kj::String>(&this->fragment);
    if ((kj *)f_2 != (kj *)0x0) {
      local_231 = '#';
      local_230 = (kj *)f_2;
      Vector<char>::add<char>((Vector<char> *)local_40,&local_231);
      if (((this->options).percentDecode & 1U) == 0) {
        str<kj::String_const&>(&local_250,local_230,params_04);
      }
      else {
        local_260 = String::operator_cast_to_ArrayPtr((String *)local_230);
        text_03.ptr = (char *)local_260.size_;
        text_03.size_ = (size_t)local_260.ptr;
        encodeUriFragment(&local_250,(kj *)local_260.ptr,text_03);
      }
      Vector<char>::addAll<kj::String>((Vector<char> *)local_40,&local_250);
      String::~String(&local_250);
    }
  }
  local_261 = '\0';
  Vector<char>::add<char>((Vector<char> *)local_40,&local_261);
  Vector<char>::releaseAsArray(&local_280,(Vector<char> *)local_40);
  String::String(__return_storage_ptr__,&local_280);
  Array<char>::~Array(&local_280);
  Vector<char>::~Vector((Vector<char> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

String Url::toString(Context context) const {
  Vector<char> chars(128);

  if (context != HTTP_REQUEST) {
    chars.addAll(scheme);
    chars.addAll("://"_kj);

    if (context == REMOTE_HREF) {
      KJ_IF_SOME(user, userInfo) {
        chars.addAll(options.percentDecode ? encodeUriUserInfo(user.username)
                                          : kj::str(user.username));
        KJ_IF_SOME(pass, user.password) {
          chars.add(':');
          chars.addAll(options.percentDecode ? encodeUriUserInfo(pass) : kj::str(pass));
        }
        chars.add('@');
      }
    }

    // RFC3986 specifies that hosts can contain percent-encoding escapes while suggesting that
    // they should only be used for UTF-8 sequences. However, the DNS standard specifies a
    // different way to encode Unicode into domain names and doesn't permit any characters which
    // would need to be escaped. Meanwhile, encodeUriComponent() here would incorrectly try to
    // escape colons and brackets (e.g. around ipv6 literal addresses). So, instead, we throw if
    // the host is invalid.
    if (HOST_CHARS.containsAll(host)) {
      chars.addAll(host);
    } else {
      KJ_FAIL_REQUIRE("invalid hostname when stringifying URL", host) {
        chars.addAll("invalid-host"_kj);
        break;
      }
    }
  }

  for (auto& pathPart: path) {
    // Protect against path injection.
    KJ_REQUIRE((pathPart != "" || options.allowEmpty) && pathPart != "." && pathPart != "..",
               "invalid name in URL path", path) {
      continue;
    }
    chars.add('/');
    chars.addAll(options.percentDecode ? encodeUriPath(pathPart) : kj::str(pathPart));
  }
  if (hasTrailingSlash || (path.size() == 0 && context == HTTP_REQUEST)) {
    chars.add('/');
  }

  bool first = true;
  for (auto& param: query) {
    chars.add(first ? '?' : '&');
    first = false;
    chars.addAll(options.percentDecode ? encodeWwwForm(param.name) : kj::str(param.name));
    if (param.value.begin() != nullptr) {
      chars.add('=');
      chars.addAll(options.percentDecode ? encodeWwwForm(param.value) : kj::str(param.value));
    }
  }

  if (context == REMOTE_HREF) {
    KJ_IF_SOME(f, fragment) {
      chars.add('#');
      chars.addAll(options.percentDecode ? encodeUriFragment(f) : kj::str(f));
    }
  }

  chars.add('\0');
  return String(chars.releaseAsArray());
}